

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::JobManager::PrepareJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  ErrorCode EVar3;
  uint64_t uVar4;
  undefined4 uVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  uint uVar12;
  ulong *puVar13;
  Error importError;
  Expression jobExpr;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  ulong *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70 [2];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  utils::ToLower((string *)local_100,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  iVar8 = std::__cxx11::string::compare(local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_100._4_4_,local_100._0_4_));
  }
  if (iVar8 == 0) {
    PrepareStartJobs((Error *)local_100,this,aExpr,aNids,aGroupAlias);
  }
  else {
    utils::ToLower((string *)local_100,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    iVar8 = std::__cxx11::string::compare(local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_100._4_4_,local_100._0_4_));
    }
    if (iVar8 != 0) {
      puVar13 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_d8 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      if (puVar13 != local_d8) {
        p_Var2 = &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header;
        do {
          p_Var10 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          p_Var9 = &p_Var2->_M_header;
          if (p_Var10 != (_Base_ptr)0x0) {
            do {
              if (*(ulong *)(p_Var10 + 1) >= *puVar13) {
                p_Var9 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < *puVar13];
            } while (p_Var10 != (_Base_ptr)0x0);
          }
          p_Var11 = p_Var2;
          if (((_Rb_tree_header *)p_Var9 != p_Var2) &&
             (p_Var11 = (_Rb_tree_header *)p_Var9,
             *puVar13 < ((_Rb_tree_header *)p_Var9)->_M_node_count)) {
            p_Var11 = p_Var2;
          }
          if (p_Var11 == p_Var2) {
            uVar12 = 8;
            if (!aGroupAlias) {
              uVar4 = *puVar13;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"not started","");
              WarningMsg(this,uVar4,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
            }
          }
          else {
            bVar6 = Interpreter::IsInactiveCommissionerAllowed(this->mInterpreter,aExpr);
            if (!bVar6) {
              bVar7 = (**(code **)(**(long **)(p_Var11 + 1) + 0x78))();
              if (bVar7 == 0 && !aGroupAlias) {
                uVar4 = *puVar13;
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b0,"not started","");
                WarningMsg(this,uVar4,&local_b0);
                uVar12 = 8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p);
                }
              }
              else {
                uVar12 = (uint)(bVar7 ^ 1) << 3;
              }
              if (bVar7 == 0) goto LAB_002021ea;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(local_70,aExpr);
            if ((this->mImportFile)._M_string_length == 0) {
LAB_00202181:
              CreateJob((Error *)local_100,this,(CommissionerAppPtr *)(p_Var11 + 1),local_70,
                        *puVar13);
              __return_storage_ptr__->mCode = local_100._0_4_;
              std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
              EVar3 = __return_storage_ptr__->mCode;
              if (local_f8._M_p != local_f0._M_local_buf + 8) {
                operator_delete(local_f8._M_p);
              }
              uVar12 = (uint)(EVar3 != kNone) << 2;
            }
            else {
              AppendImport((Error *)local_100,this,*puVar13,local_70);
              uVar5 = local_100._0_4_;
              if (local_100._0_4_ == kNone) {
                uVar12 = 0;
              }
              else {
                uVar4 = *puVar13;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d0,local_f8._M_p,
                           local_f8._M_p + local_f0._M_allocated_capacity);
                ErrorMsg(this,uVar4,&local_d0);
                uVar12 = 8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p);
                }
              }
              if (local_f8._M_p != local_f0._M_local_buf + 8) {
                operator_delete(local_f8._M_p);
              }
              if (uVar5 == kNone) goto LAB_00202181;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_70);
          }
LAB_002021ea:
          if ((uVar12 & 7) != 0) goto LAB_00202205;
          puVar13 = puVar13 + 1;
        } while (puVar13 != local_d8);
      }
      uVar12 = 7;
LAB_00202205:
      if (uVar12 == 4) {
        return __return_storage_ptr__;
      }
      if (uVar12 == 7) {
        return __return_storage_ptr__;
      }
      local_f8._M_p = (this_00->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p == paVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_0020228b;
    }
    PrepareStopJobs((Error *)local_100,this,aExpr,aNids,aGroupAlias);
  }
  __return_storage_ptr__->mCode = local_100._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
  if (local_f8._M_p == local_f0._M_local_buf + 8) {
    return __return_storage_ptr__;
  }
LAB_0020228b:
  operator_delete(local_f8._M_p);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareJobs(const Interpreter::Expression &aExpr,
                              const std::vector<uint64_t>   &aNids,
                              bool                           aGroupAlias)
{
    Error error;

    if (utils::ToLower(aExpr[0]) == "start")
    {
        ExitNow(error = PrepareStartJobs(aExpr, aNids, aGroupAlias));
    }
    else if (utils::ToLower(aExpr[0]) == "stop")
    {
        ExitNow(error = PrepareStopJobs(aExpr, aNids, aGroupAlias));
    }

    for (const auto &nid : aNids)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry == mCommissionerPool.end())
        {
            if (!aGroupAlias)
            {
                WarningMsg(nid, "not started");
            }
            continue;
        }

        bool isInactiveAllowed = mInterpreter.IsInactiveCommissionerAllowed(aExpr);
        if (!isInactiveAllowed)
        {
            bool active = entry->second->IsActive();
            if (!active)
            {
                if (!aGroupAlias)
                {
                    WarningMsg(nid, "not started");
                }
                continue;
            }
        }

        Interpreter::Expression jobExpr = aExpr;

        if (!mImportFile.empty())
        {
            Error importError = AppendImport(nid, jobExpr);
            if (importError != ERROR_NONE)
            {
                ErrorMsg(nid, importError.GetMessage());
                continue;
            }
        }

        SuccessOrExit(error = CreateJob(entry->second, jobExpr, nid));
    }

exit:
    return error;
}